

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O0

int NGA_Locate_nnodes(int g_a,int *lo,int *hi)

{
  long in_RDX;
  long in_RSI;
  int in_EDI;
  int i_1;
  int i;
  Integer _ga_hi [7];
  Integer _ga_lo [7];
  Integer ndim;
  Integer np;
  Integer a;
  Integer in_stack_00000140;
  Integer *in_stack_00000430;
  Integer *in_stack_00000438;
  Integer *in_stack_00000440;
  Integer in_stack_00000448;
  int local_b0;
  int local_ac;
  long local_a8 [8];
  long local_68 [7];
  long local_30;
  int local_28;
  long local_20;
  long local_18;
  long local_10;
  
  local_20 = (long)in_EDI;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_30 = pnga_ndim(in_stack_00000140);
  for (local_ac = 0; local_ac < local_30; local_ac = local_ac + 1) {
    local_68[(local_30 - local_ac) + -1] = (long)*(int *)(local_10 + (long)local_ac * 4) + 1;
  }
  for (local_b0 = 0; local_b0 < local_30; local_b0 = local_b0 + 1) {
    local_a8[(local_30 - local_b0) + -1] = (long)*(int *)(local_18 + (long)local_b0 * 4) + 1;
  }
  pnga_locate_nnodes(in_stack_00000448,in_stack_00000440,in_stack_00000438,in_stack_00000430);
  return local_28;
}

Assistant:

int NGA_Locate_nnodes(int g_a, int lo[], int hi[])
{
     /* logical st; */
     Integer a=(Integer)g_a, np;
     Integer ndim = wnga_ndim(a);
     Integer _ga_lo[MAXDIM], _ga_hi[MAXDIM];

     COPYINDEX_C2F(lo,_ga_lo,ndim);
     COPYINDEX_C2F(hi,_ga_hi,ndim);
     /* st = wnga_locate_nnodes(a, _ga_lo, _ga_hi, &np); */
     (void)wnga_locate_nnodes(a, _ga_lo, _ga_hi, &np);
     return (int)np;
}